

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_GLSL_start(Context *ctx,char *profilestr)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  
  if (1 < ctx->shader_type - MOJOSHADER_TYPE_PIXEL) {
    failf(ctx,"Shader type %u unsupported in this profile.");
    return;
  }
  iVar1 = strcmp(profilestr,"glsl");
  if (iVar1 == 0) {
    push_output(ctx,&ctx->preflight);
    pcVar3 = "#version 110";
  }
  else {
    iVar1 = strcmp(profilestr,"glsl120");
    if (iVar1 == 0) {
      ctx->profile_supports_glsl120 = 1;
      push_output(ctx,&ctx->preflight);
      pcVar3 = "#version 120";
    }
    else {
      iVar1 = strcmp(profilestr,"glsles");
      if (iVar1 != 0) {
        failf(ctx,"Profile \'%s\' unsupported or unknown.",profilestr);
        return;
      }
      ctx->profile_supports_glsles = 1;
      push_output(ctx,&ctx->preflight);
      output_line(ctx,"#version 100");
      pcVar3 = "precision mediump float;";
      if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
        pcVar3 = "precision highp float;";
      }
      output_line(ctx,pcVar3);
      output_line(ctx,"precision mediump int;");
      output_line(ctx,"varying highp vec4 v_FrontColor;");
      output_line(ctx,"varying highp vec4 v_FrontSecondaryColor;");
      pcVar3 = "varying highp vec4 v_TexCoord[10];";
    }
  }
  output_line(ctx,pcVar3);
  iVar1 = ctx->output_stack_len;
  if (0 < iVar1) {
    ctx->output_stack_len = iVar1 - 1U;
    ctx->output = ctx->output_stack[iVar1 - 1U];
    ctx->indent = ctx->indent_stack[(long)iVar1 + -1];
    push_output(ctx,&ctx->mainline_intro);
    output_line(ctx,"void main()");
    output_line(ctx,"{");
    lVar2 = (long)ctx->output_stack_len;
    if (0 < lVar2) {
      ctx->output_stack_len = (int)(lVar2 - 1U);
      ctx->output = ctx->output_stack[lVar2 - 1U & 0xffffffff];
      ctx->indent = ctx->indent_stack[lVar2 + -1];
      set_output(ctx,&ctx->mainline);
      ctx->indent = ctx->indent + 1;
      return;
    }
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_GLSL_start(Context *ctx, const char *profilestr)
{
    if (!shader_is_vertex(ctx) && !shader_is_pixel(ctx))
    {
        failf(ctx, "Shader type %u unsupported in this profile.",
              (uint) ctx->shader_type);
        return;
    } // if

    else if (strcmp(profilestr, MOJOSHADER_PROFILE_GLSL) == 0)
    {
        // No gl_FragData[] before GLSL 1.10, so we have to force the version.
        push_output(ctx, &ctx->preflight);
        output_line(ctx, "#version 110");
        pop_output(ctx);
    } // else if

    #if SUPPORT_PROFILE_GLSL120
    else if (strcmp(profilestr, MOJOSHADER_PROFILE_GLSL120) == 0)
    {
        ctx->profile_supports_glsl120 = 1;
        push_output(ctx, &ctx->preflight);
        output_line(ctx, "#version 120");
        pop_output(ctx);
    } // else if
    #endif

    #if SUPPORT_PROFILE_GLSLES
    else if (strcmp(profilestr, MOJOSHADER_PROFILE_GLSLES) == 0)
    {
        ctx->profile_supports_glsles = 1;
        push_output(ctx, &ctx->preflight);
        output_line(ctx, "#version 100");
        if (shader_is_vertex(ctx))
            output_line(ctx, "precision highp float;");
        else
            output_line(ctx, "precision mediump float;");
        output_line(ctx, "precision mediump int;");
        // Some drivers don't like it when the precision varies between shaders. -ade
        output_line(ctx, "varying highp vec4 v_FrontColor;");
        output_line(ctx, "varying highp vec4 v_FrontSecondaryColor;");
        output_line(ctx, "varying highp vec4 v_TexCoord[10];"); // 10 according to SM3
        pop_output(ctx);
    } // else if
    #endif

    else
    {
        failf(ctx, "Profile '%s' unsupported or unknown.", profilestr);
        return;
    } // else

    push_output(ctx, &ctx->mainline_intro);
    output_line(ctx, "void main()");
    output_line(ctx, "{");
    pop_output(ctx);

    set_output(ctx, &ctx->mainline);
    ctx->indent++;
}